

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stringencode.cc
# Opt level: O0

size_t rtc::tokenize(string *source,char delimiter,
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *fields)

{
  ulong uVar1;
  size_t sVar2;
  size_t this;
  string *psVar3;
  ulong uVar4;
  char *pcVar5;
  size_t sVar6;
  size_type sVar7;
  value_type local_80 [48];
  value_type local_50 [32];
  ulong local_30;
  size_t i;
  size_t last;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *fields_local;
  string *psStack_10;
  char delimiter_local;
  string *source_local;
  
  last = (size_t)fields;
  fields_local._7_1_ = delimiter;
  psStack_10 = source;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear(fields);
  i = 0;
  local_30 = 0;
  while( true ) {
    uVar1 = local_30;
    uVar4 = std::__cxx11::string::length();
    sVar2 = i;
    if (uVar4 <= uVar1) break;
    pcVar5 = (char *)std::__cxx11::string::operator[]((ulong)psStack_10);
    sVar2 = last;
    if (*pcVar5 == fields_local._7_1_) {
      if (local_30 != i) {
        std::__cxx11::string::substr((ulong)local_50,(ulong)psStack_10);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)sVar2,local_50);
        std::__cxx11::string::~string((string *)local_50);
      }
      i = local_30 + 1;
    }
    local_30 = local_30 + 1;
  }
  sVar6 = std::__cxx11::string::length();
  psVar3 = psStack_10;
  this = last;
  if (sVar2 != sVar6) {
    std::__cxx11::string::length();
    std::__cxx11::string::substr((ulong)local_80,(ulong)psVar3);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)this,local_80);
    std::__cxx11::string::~string((string *)local_80);
  }
  sVar7 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)last);
  return sVar7;
}

Assistant:

size_t tokenize(const std::string& source, char delimiter,
                std::vector<std::string>* fields) {
  fields->clear();
  size_t last = 0;
  for (size_t i = 0; i < source.length(); ++i) {
    if (source[i] == delimiter) {
      if (i != last) {
        fields->push_back(source.substr(last, i - last));
      }
      last = i + 1;
    }
  }
  if (last != source.length()) {
    fields->push_back(source.substr(last, source.length() - last));
  }
  return fields->size();
}